

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * __thiscall
el::base::utils::DateTime::timevalToString_abi_cxx11_
          (string *__return_storage_ptr__,DateTime *this,timeval tval,char *format,
          SubsecondPrecision *ssPrec)

{
  allocator<char> local_99;
  char local_98 [8];
  char buff_ [30];
  undefined1 local_68 [4];
  int kBuffSize;
  tm timeInfo;
  SubsecondPrecision *ssPrec_local;
  char *format_local;
  timeval tval_local;
  
  tval_local.tv_sec = tval.tv_sec;
  timeInfo.tm_zone = format;
  format_local = (char *)this;
  tval_local.tv_usec = (__suseconds_t)__return_storage_ptr__;
  buildTimeInfo((timeval *)&format_local,(tm *)local_68);
  buff_[8] = '\0';
  buff_[9] = '\0';
  buff_[10] = '\0';
  buff_[0xb] = '\0';
  buff_[0xc] = '\0';
  buff_[0xd] = '\0';
  buff_[0xe] = '\0';
  buff_[0xf] = '\0';
  buff_[0x10] = '\0';
  buff_[0x11] = '\0';
  buff_[0x12] = '\0';
  buff_[0x13] = '\0';
  buff_[0x14] = '\0';
  buff_[0x15] = '\0';
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  buff_[0] = '\0';
  buff_[1] = '\0';
  buff_[2] = '\0';
  buff_[3] = '\0';
  buff_[4] = '\0';
  buff_[5] = '\0';
  buff_[6] = '\0';
  buff_[7] = '\0';
  parseFormat(local_98,0x1e,(char *)tval.tv_usec,(tm *)local_68,
              tval_local.tv_sec / (long)(ulong)*(uint *)(timeInfo.tm_zone + 4),
              (SubsecondPrecision *)timeInfo.tm_zone);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_98,&local_99);
  ::std::allocator<char>::~allocator(&local_99);
  return __return_storage_ptr__;
}

Assistant:

std::string DateTime::timevalToString(struct timeval tval, const char* format,
                                      const el::base::SubsecondPrecision* ssPrec) {
  struct ::tm timeInfo;
  buildTimeInfo(&tval, &timeInfo);
  const int kBuffSize = 30;
  char buff_[kBuffSize] = "";
  parseFormat(buff_, kBuffSize, format, &timeInfo, static_cast<std::size_t>(tval.tv_usec / ssPrec->m_offset),
              ssPrec);
  return std::string(buff_);
}